

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minigzip.c
# Opt level: O3

void gz_compress(FILE *in,gzFile out)

{
  undefined1 *__ptr;
  bool bVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  gzFile pgVar6;
  size_t sVar7;
  gzFile pgVar8;
  char *pcVar9;
  char *pcVar10;
  ulong unaff_RBP;
  FILE *pFVar11;
  char *pcVar12;
  char *pcVar13;
  FILE *pFVar14;
  FILE *__s;
  char *pcVar15;
  ulong uVar16;
  ulong uVar17;
  char *pcVar18;
  bool bVar19;
  int err;
  char buf [16384];
  undefined4 uStack_88f8;
  undefined1 uStack_88f4;
  char *pcStack_88e0;
  gzFile pgStack_88d8;
  ulong uStack_88d0;
  char *pcStack_88c8;
  char *pcStack_88c0;
  code *pcStack_88b8;
  char acStack_88b0 [1024];
  FILE *pFStack_84b0;
  gzFile pgStack_84a8;
  char acStack_8488 [1024];
  FILE *pFStack_8088;
  FILE *pFStack_8080;
  code *pcStack_8078;
  char acStack_8064 [4];
  char acStack_8060 [16392];
  gzFile pgStack_4058;
  FILE *pFStack_4050;
  undefined1 *puStack_4048;
  FILE local_402c [75];
  
  __ptr = &local_402c[0].field_0x4;
  do {
    pFVar11 = (FILE *)0x1;
    pgVar6 = (gzFile)fread(__ptr,1,0x4000,(FILE *)in);
    pFVar14 = (FILE *)in;
    iVar3 = ferror((FILE *)in);
    if (iVar3 != 0) {
      gz_compress_cold_1();
      goto LAB_001015d3;
    }
    if ((int)pgVar6 == 0) goto LAB_001015ab;
    iVar3 = gzwrite(out,__ptr,(ulong)pgVar6 & 0xffffffff);
  } while (iVar3 == (int)pgVar6);
  pFVar11 = local_402c;
  gz_compress_cold_2();
LAB_001015ab:
  fclose((FILE *)in);
  pFVar14 = (FILE *)out;
  iVar3 = gzclose();
  if (iVar3 == 0) {
    return;
  }
LAB_001015d3:
  gz_compress_cold_3();
  pgStack_4058 = out;
  pFStack_4050 = in;
  puStack_4048 = __ptr;
  do {
    pcStack_8078 = (code *)0x101600;
    pcVar12 = acStack_8060;
    uVar4 = gzread(pFVar14,acStack_8060,0x4000);
    if ((int)uVar4 < 0) {
      pcVar12 = acStack_8064;
      pcStack_8078 = (code *)0x101656;
      __s = pFVar14;
      gz_uncompress_cold_4();
      goto LAB_00101656;
    }
    if (uVar4 == 0) goto LAB_00101623;
    unaff_RBP = (ulong)uVar4;
    pcVar12 = (char *)0x1;
    pcStack_8078 = (code *)0x10161a;
    sVar7 = fwrite(acStack_8060,1,(ulong)uVar4,pFVar11);
  } while (uVar4 == (uint)sVar7);
  pcStack_8078 = (code *)0x101623;
  gz_uncompress_cold_1();
LAB_00101623:
  pcStack_8078 = (code *)0x10162b;
  __s = pFVar11;
  iVar3 = fclose(pFVar11);
  if (iVar3 == 0) {
    pcStack_8078 = (code *)0x101637;
    __s = pFVar14;
    iVar3 = gzclose();
    if (iVar3 == 0) {
      return;
    }
  }
  else {
LAB_00101656:
    pcStack_8078 = (code *)0x10165b;
    gz_uncompress_cold_2();
  }
  pcStack_8078 = file_compress;
  gz_uncompress_cold_3();
  pcVar10 = acStack_8488;
  pcVar13 = pcVar12;
  pFStack_8088 = pFVar14;
  pFStack_8080 = pFVar11;
  pcStack_8078 = (code *)acStack_8060;
  sVar7 = strlen((char *)__s);
  if (sVar7 - 0x3fd < 0xfffffffffffffc00) {
    file_compress_cold_3();
LAB_001016f1:
    file_compress_cold_2();
  }
  else {
    snprintf(acStack_8488,0x400,"%s%s",__s,".gz");
    pcVar13 = "rb";
    pFVar11 = fopen64((char *)__s,"rb");
    if (pFVar11 == (FILE *)0x0) goto LAB_001016f1;
    pcVar13 = pcVar12;
    pgVar8 = (gzFile)gzopen64(acStack_8488);
    if (pgVar8 != (gzFile)0x0) {
      gz_compress((FILE *)pFVar11,pgVar8);
      unlink((char *)__s);
      return;
    }
  }
  file_compress_cold_1();
  pcVar18 = acStack_88b0;
  pcStack_88b8 = (code *)0x101719;
  pFStack_84b0 = __s;
  pgStack_84a8 = pgVar6;
  pcVar9 = (char *)strlen(pcVar10);
  uVar16 = (ulong)pcVar9 & 0xffffffff;
  if (uVar16 < 0x3fd) {
    pgVar6 = (gzFile)0x400;
    pcStack_88b8 = (code *)0x10174e;
    snprintf(acStack_88b0,0x400,"%s",pcVar10);
    if ((uint)pcVar9 < 4) {
LAB_0010176c:
      pgVar6 = (gzFile)(0x400 - uVar16);
      pcStack_88b8 = (code *)0x10178b;
      snprintf(acStack_88b0 + uVar16,(size_t)pgVar6,"%s",".gz");
      pcVar12 = acStack_88b0;
      pcVar18 = pcVar10;
    }
    else {
      pcStack_88b8 = (code *)0x101768;
      iVar3 = strcmp(pcVar10 + (uVar16 - 3),".gz");
      if (iVar3 != 0) goto LAB_0010176c;
      acStack_88b0[(uint)pcVar9 - 3] = '\0';
      pcVar12 = pcVar10;
    }
    pcVar13 = "rb";
    pcStack_88b8 = (code *)0x10179d;
    pgVar8 = (gzFile)gzopen64(pcVar12);
    pcVar9 = pcVar18;
    if (pgVar8 == (gzFile)0x0) goto LAB_001017f3;
    pcVar13 = "wb";
    pcStack_88b8 = (code *)0x1017b4;
    pFVar11 = fopen64(pcVar18,"wb");
    if (pFVar11 != (FILE *)0x0) {
      pcStack_88b8 = (code *)0x1017c4;
      gz_uncompress(pgVar8,(FILE *)pFVar11);
      pcStack_88b8 = (code *)0x1017cc;
      unlink(pcVar12);
      return;
    }
  }
  else {
    pcStack_88b8 = (code *)0x1017f3;
    file_uncompress_cold_3();
LAB_001017f3:
    pgVar8 = pgVar6;
    pcStack_88b8 = (code *)0x1017fb;
    file_uncompress_cold_2();
  }
  pcStack_88b8 = main;
  pcVar15 = pcVar10;
  file_uncompress_cold_1();
  uVar17 = (ulong)pcVar15 & 0xffffffff;
  uStack_88f4 = 0;
  uStack_88f8 = 0x20366277;
  pcVar18 = *(char **)pcVar13;
  prog = pcVar18;
  pcStack_88e0 = pcVar10;
  pgStack_88d8 = pgVar8;
  uStack_88d0 = uVar16;
  pcStack_88c8 = pcVar12;
  pcStack_88c0 = pcVar9;
  pcStack_88b8 = (code *)unaff_RBP;
  pcVar10 = strrchr(pcVar18,0x2f);
  pcVar12 = pcVar10 + 1;
  if (pcVar10 == (char *)0x0) {
    pcVar12 = pcVar18;
  }
  iVar3 = strcmp(pcVar12,"gunzip");
  if (iVar3 == 0) {
    bVar19 = true;
    bVar1 = false;
  }
  else {
    iVar3 = strcmp(pcVar12,"zcat");
    bVar19 = iVar3 == 0;
    bVar1 = bVar19;
  }
  pcVar13 = pcVar13 + 8;
  iVar3 = (int)pcVar15 + -1;
  if ((int)pcVar15 < 2) {
LAB_0010193b:
    uStack_88f8 = uStack_88f8 & 0xffffff;
  }
  else {
    cVar2 = ' ';
    do {
      pcVar12 = *(char **)pcVar13;
      if (*pcVar12 != '-') goto LAB_00101937;
      if ((pcVar12[1] == 'c') && (pcVar12[2] == '\0')) {
        bVar1 = true;
      }
      else if ((pcVar12[1] == 'd') && (pcVar12[2] == '\0')) {
        bVar19 = true;
      }
      else if ((pcVar12[1] == 'f') && (pcVar12[2] == '\0')) {
        uStack_88f8 = CONCAT13(0x66,(undefined3)uStack_88f8);
        cVar2 = 'f';
      }
      else if ((pcVar12[1] == 'h') && (pcVar12[2] == '\0')) {
        uStack_88f8 = CONCAT13(0x68,(undefined3)uStack_88f8);
        cVar2 = 'h';
      }
      else if ((pcVar12[1] == 'r') && (pcVar12[2] == '\0')) {
        uStack_88f8 = CONCAT13(0x52,(undefined3)uStack_88f8);
        cVar2 = 'R';
      }
      else {
        if (8 < (byte)(pcVar12[1] - 0x31U)) goto LAB_00101937;
        if (pcVar12[2] != '\0') {
          iVar3 = (int)uVar17 + -1;
          goto LAB_00101937;
        }
        uStack_88f8._0_3_ = CONCAT12(pcVar12[1],(undefined2)uStack_88f8);
      }
      pcVar13 = pcVar13 + 8;
      iVar3 = iVar3 + -1;
      uVar4 = (int)uVar17 - 1;
      uVar17 = (ulong)uVar4;
    } while (1 < (int)uVar4);
    iVar3 = 0;
LAB_00101937:
    if (cVar2 == ' ') goto LAB_0010193b;
  }
  if (iVar3 == 0) {
    if (bVar19) {
      iVar3 = fileno(_stdin);
      pgVar6 = (gzFile)gzdopen(iVar3,"rb");
      if (pgVar6 == (gzFile)0x0) {
LAB_00101a73:
        main_cold_3();
LAB_00101a78:
        main_cold_4();
        halt_baddata();
      }
      gz_uncompress(pgVar6,(FILE *)_stdout);
    }
    else {
      iVar3 = fileno(_stdout);
      pgVar6 = (gzFile)gzdopen(iVar3,&uStack_88f8);
      if (pgVar6 == (gzFile)0x0) goto LAB_00101a78;
      gz_compress((FILE *)_stdin,pgVar6);
    }
  }
  else {
    do {
      pcVar12 = *(char **)pcVar13;
      if (bVar19) {
        if (bVar1) {
          pgVar6 = (gzFile)gzopen64(pcVar12,"rb");
          if (pgVar6 == (gzFile)0x0) {
            main_cold_1();
          }
          else {
            gz_uncompress(pgVar6,(FILE *)_stdout);
          }
        }
        else {
          file_uncompress(pcVar12);
        }
      }
      else if (bVar1) {
        pFVar11 = fopen64(pcVar12,"rb");
        if (pFVar11 == (FILE *)0x0) {
          perror(*(char **)pcVar13);
        }
        else {
          iVar5 = fileno(_stdout);
          pgVar6 = (gzFile)gzdopen(iVar5,&uStack_88f8);
          if (pgVar6 == (gzFile)0x0) {
            main_cold_2();
            goto LAB_00101a73;
          }
          gz_compress((FILE *)pFVar11,pgVar6);
        }
      }
      else {
        file_compress(pcVar12,(char *)&uStack_88f8);
      }
      pcVar13 = pcVar13 + 8;
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  return;
}

Assistant:

void gz_compress(in, out)
    FILE   *in;
    gzFile out;
{
    local char buf[BUFLEN];
    int len;
    int err;

#ifdef USE_MMAP
    /* Try first compressing with mmap. If mmap fails (minigzip used in a
     * pipe), use the normal fread loop.
     */
    if (gz_compress_mmap(in, out) == Z_OK) return;
#endif
    for (;;) {
        len = (int)fread(buf, 1, sizeof(buf), in);
        if (ferror(in)) {
            perror("fread");
            exit(1);
        }
        if (len == 0) break;

        if (gzwrite(out, buf, (unsigned)len) != len) error(gzerror(out, &err));
    }
    fclose(in);
    if (gzclose(out) != Z_OK) error("failed gzclose");
}